

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

void llhttp_reset(llhttp_t *parser)

{
  uint8_t uVar1;
  uint16_t uVar2;
  void *pvVar3;
  void *pvVar4;
  
  uVar1 = parser->type;
  pvVar3 = parser->settings;
  pvVar4 = parser->data;
  uVar2 = parser->lenient_flags;
  llhttp__internal_init(parser);
  parser->type = uVar1;
  parser->settings = pvVar3;
  parser->data = pvVar4;
  parser->lenient_flags = uVar2;
  return;
}

Assistant:

void llhttp_reset(llhttp_t* parser) {
  llhttp_type_t type = parser->type;
  const llhttp_settings_t* settings = parser->settings;
  void* data = parser->data;
  uint16_t lenient_flags = parser->lenient_flags;

  llhttp__internal_init(parser);

  parser->type = type;
  parser->settings = (void*) settings;
  parser->data = data;
  parser->lenient_flags = lenient_flags;
}